

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Id __thiscall
anon_unknown.dwarf_12b4667::TGlslangToSpvTraverser::accessChainLoad
          (TGlslangToSpvTraverser *this,TType *type)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x_00;
  undefined8 uVar1;
  Id resultType;
  CoherentFlags CVar2;
  MemoryAccessMask MVar3;
  int iVar4;
  uint uVar5;
  Decoration l_nonUniform;
  Decoration r_nonUniform;
  Scope scope;
  Id loadedId;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TType *type_00;
  Decoration precision;
  CoherentFlags coherentFlags;
  CoherentFlags local_88 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  Id local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  CoherentFlags local_38 [2];
  
  resultType = spv::Builder::accessChainGetInferredType(&this->builder);
  local_88[0] = (CoherentFlags)(this->builder).accessChain.base;
  __x = &(this->builder).accessChain.indexChain;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,__x);
  local_68 = (this->builder).accessChain.instr;
  __x_00 = &(this->builder).accessChain.swizzle;
  type_00 = (TType *)__x_00;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,__x_00);
  local_38[0]._0_2_ = *(undefined2 *)&(this->builder).accessChain.coherentFlags;
  local_48._0_4_ = (this->builder).accessChain.component;
  local_48._4_4_ = (this->builder).accessChain.preSwizzleBaseType;
  uStack_40._0_1_ = (this->builder).accessChain.isRValue;
  uStack_40._1_3_ = *(undefined3 *)&(this->builder).accessChain.field_0x49;
  uStack_40._4_4_ = (this->builder).accessChain.alignment;
  coherentFlags = local_38[0];
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    type_00 = (TType *)((long)local_60.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                       (long)local_60.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,(ulong)type_00);
  }
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    type_00 = (TType *)((long)local_80.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                       (long)local_80.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,(ulong)type_00);
  }
  CVar2 = TranslateCoherent((TGlslangToSpvTraverser *)type,type_00);
  local_88[0]._0_2_ = CVar2._0_2_;
  spv::Builder::AccessChain::CoherentFlags::operator|=(&coherentFlags,local_88);
  MVar3 = TranslateMemoryAccess(this,&coherentFlags);
  MVar3 = MVar3 & ~MakePointerAvailable;
  iVar4 = (*type->_vptr_TType[0xb])(type);
  if (((*(uint *)(CONCAT44(extraout_var,iVar4) + 8) & 0xff80) == 0x2400) &&
     (this->glslangIntermediate->useVulkanMemoryModel == true)) {
    MVar3 = MVar3 | 0x105ff < (this->glslangIntermediate->spvVersion).spv;
  }
  local_88[0] = (CoherentFlags)(this->builder).accessChain.base;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,__x);
  local_68 = (this->builder).accessChain.instr;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,__x_00);
  local_48._0_4_ = (this->builder).accessChain.component;
  local_48._4_4_ = (this->builder).accessChain.preSwizzleBaseType;
  uVar1._0_1_ = (this->builder).accessChain.isRValue;
  uVar1._1_3_ = *(undefined3 *)&(this->builder).accessChain.field_0x49;
  uVar1._4_4_ = (this->builder).accessChain.alignment;
  local_38[0]._0_2_ = *(undefined2 *)&(this->builder).accessChain.coherentFlags;
  uStack_40 = uVar1;
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  uVar5 = glslang::TType::getBufferReferenceAlignment(type);
  iVar4 = (*type->_vptr_TType[0xb])(type);
  precision = DecorationMax;
  if ((*(uint *)(CONCAT44(extraout_var_00,iVar4) + 8) >> 0x19 & 7) - 1 < 2) {
    precision = DecorationRelaxedPrecision;
  }
  local_88[0] = (CoherentFlags)(this->builder).accessChain.base;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,__x);
  local_68 = (this->builder).accessChain.instr;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,__x_00);
  local_38[0]._0_2_ = *(undefined2 *)&(this->builder).accessChain.coherentFlags;
  local_48._0_4_ = (this->builder).accessChain.component;
  local_48._4_4_ = (this->builder).accessChain.preSwizzleBaseType;
  uStack_40._0_1_ = (this->builder).accessChain.isRValue;
  uStack_40._1_3_ = *(undefined3 *)&(this->builder).accessChain.field_0x49;
  uStack_40._4_4_ = (this->builder).accessChain.alignment;
  l_nonUniform = TranslateNonUniformDecoration(this,local_38);
  iVar4 = (*type->_vptr_TType[0xb])(type);
  r_nonUniform = TranslateNonUniformDecoration(this,(TQualifier *)CONCAT44(extraout_var_01,iVar4));
  scope = TranslateMemoryScope(this,&coherentFlags);
  loadedId = spv::Builder::accessChainLoad
                       (&this->builder,precision,l_nonUniform,r_nonUniform,resultType,MVar3,scope,
                        uVar5 | uVar1._4_4_);
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  iVar4 = (*type->_vptr_TType[7])(type);
  if (iVar4 == 0xc) {
    loadedId = convertLoadedBoolInUniformToUint(this,type,resultType,loadedId);
  }
  return loadedId;
}

Assistant:

spv::Id TGlslangToSpvTraverser::accessChainLoad(const glslang::TType& type)
{
    spv::Id nominalTypeId = builder.accessChainGetInferredType();

    spv::Builder::AccessChain::CoherentFlags coherentFlags = builder.getAccessChain().coherentFlags;
    coherentFlags |= TranslateCoherent(type);

    spv::MemoryAccessMask accessMask = spv::MemoryAccessMask(TranslateMemoryAccess(coherentFlags) & ~spv::MemoryAccessMakePointerAvailableKHRMask);
    // If the value being loaded is HelperInvocation, SPIR-V 1.6 is being generated (so that
    // SPV_EXT_demote_to_helper_invocation is in core) and the memory model is in use, add
    // the Volatile MemoryAccess semantic.
    if (type.getQualifier().builtIn == glslang::EbvHelperInvocation &&
        glslangIntermediate->usingVulkanMemoryModel() &&
        glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_6) {
        accessMask = spv::MemoryAccessMask(accessMask | spv::MemoryAccessVolatileMask);
    }

    unsigned int alignment = builder.getAccessChain().alignment;
    alignment |= type.getBufferReferenceAlignment();

    spv::Id loadedId = builder.accessChainLoad(TranslatePrecisionDecoration(type),
        TranslateNonUniformDecoration(builder.getAccessChain().coherentFlags),
        TranslateNonUniformDecoration(type.getQualifier()),
        nominalTypeId,
        accessMask,
        TranslateMemoryScope(coherentFlags),
        alignment);

    // Need to convert to abstract types when necessary
    if (type.getBasicType() == glslang::EbtBool) {
        loadedId = convertLoadedBoolInUniformToUint(type, nominalTypeId, loadedId);
    }

    return loadedId;
}